

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

char * glfwGetJoystickGUID(int jid)

{
  GLFWbool GVar1;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                  ,0x49e,"const char *glfwGetJoystickGUID(int)");
  }
  if (0xf < jid) {
    __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                  ,0x49f,"const char *glfwGetJoystickGUID(int)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((_glfw.joysticksInitialized == 0) &&
          (GVar1 = (*_glfw.platform.initJoysticks)(), GVar1 == 0)) {
    (*_glfw.platform.terminateJoysticks)();
  }
  else {
    _glfw.joysticksInitialized = 1;
    if (_glfw.joysticks[(uint)jid].connected != 0) {
      GVar1 = (*_glfw.platform.pollJoystick)(_glfw.joysticks + (uint)jid,0);
      if (GVar1 != 0) {
        return _glfw.joysticks[(uint)jid].guid;
      }
      return (char *)0x0;
    }
  }
  return (char *)0x0;
}

Assistant:

GLFWAPI const char* glfwGetJoystickGUID(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    if (!initJoysticks())
        return NULL;

    js = _glfw.joysticks + jid;
    if (!js->connected)
        return NULL;

    if (!_glfw.platform.pollJoystick(js, _GLFW_POLL_PRESENCE))
        return NULL;

    return js->guid;
}